

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,char_const*,fmt::v8::detail::digit_grouping<char16_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,char *significand,
          int significand_size,int integral_size,char16_t decimal_point,
          digit_grouping<char16_t> *grouping)

{
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar1;
  basic_string_view<char16_t> digits;
  undefined **local_438;
  undefined1 *local_430;
  long lStack_428;
  long local_420;
  undefined1 local_418 [1008];
  
  if ((grouping->sep_).thousands_sep == L'\0') {
    bVar1 = write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>
                      (out,significand,significand_size,integral_size,decimal_point);
    return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar1.container;
  }
  lStack_428 = 0;
  local_438 = &PTR_grow_001b28b0;
  local_420 = 500;
  local_430 = local_418;
  write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>
            ((buffer<char16_t> *)&local_438,significand,significand_size,integral_size,decimal_point
            );
  if (-1 < integral_size) {
    digits.size_._0_4_ = integral_size;
    digits.data_ = (char16_t *)local_430;
    digits.size_._4_4_ = 0;
    digit_grouping<char16_t>::
    apply<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t>
              (grouping,out,digits);
    bVar1 = copy_str_noinline<char16_t,char16_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                      ((char16_t *)(local_430 + (ulong)(uint)integral_size * 2),
                       (char16_t *)(local_430 + lStack_428 * 2),out);
    if (local_430 != local_418) {
      operator_delete(local_430,local_420 * 2);
    }
    return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar1.container;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
             ,0x195,"negative value");
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}